

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_SetStrOption_Test::~SolverTest_SetStrOption_Test(SolverTest_SetStrOption_Test *this)

{
  void *in_RDI;
  
  ~SolverTest_SetStrOption_Test((SolverTest_SetStrOption_Test *)0x164d38);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SolverTest, SetStrOption) {
  TestSolverWithOptions test_solver;
  Solver &s = test_solver;
  s.SetStrOption("stropt1", "abc");
  EXPECT_EQ("abc", test_solver.stropt1);
  s.SetStrOption("stropt1", "def");
  EXPECT_EQ("def", test_solver.stropt1);
  EXPECT_THROW(s.SetIntOption("stropt1", 0), OptionError);
  EXPECT_THROW(s.SetDblOption("stropt1", 0), OptionError);
  EXPECT_THROW(s.SetStrOption("badopt", ""), OptionError);
}